

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPC_TreeCollider.cpp
# Opt level: O2

void __thiscall
Opcode::AABBTreeCollider::_CollideBoxTri(AABBTreeCollider *this,AABBQuantizedNoLeafNode *b)

{
  Point *v0;
  Point *v1;
  Point *v2;
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined8 uVar3;
  undefined8 uVar4;
  udword uVar7;
  AABBQuantizedNoLeafNode *b_00;
  MeshInterface *pMVar8;
  IndexedTriangle *pIVar9;
  udword q;
  BOOL BVar10;
  long lVar11;
  ulong uVar12;
  Point *pPVar13;
  udword *puVar14;
  udword uVar15;
  ulong uVar16;
  Point *pPVar17;
  ulong uVar18;
  Point *pPVar19;
  uint uVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  Point vmin;
  Point vmax;
  float local_e8;
  undefined8 local_80;
  float local_78;
  Point normal;
  
  do {
    fVar24 = (float)(int)(b->mAABB).mCenter[0] * (this->mCenterCoeff0).x;
    fVar22 = (float)(int)(b->mAABB).mCenter[1] * (this->mCenterCoeff0).y;
    fVar21 = (float)(int)(b->mAABB).mCenter[2] * (this->mCenterCoeff0).z;
    local_78 = (float)(b->mAABB).mExtents[2] * (this->mExtentsCoeff0).z;
    uVar20 = *(uint *)(b->mAABB).mExtents;
    uVar1 = (this->mExtentsCoeff0).x;
    uVar5 = (this->mExtentsCoeff0).y;
    fVar40 = (float)uVar1 * (float)(uVar20 & 0xffff);
    fVar42 = (float)uVar5 * (float)(uVar20 >> 0x10);
    local_80 = CONCAT44(fVar42,fVar40);
    this->mNbBVPrimTests = this->mNbBVPrimTests + 1;
    fVar41 = this->mLeafVerts[0].x;
    fVar29 = this->mLeafVerts[1].x;
    fVar44 = fVar41 - fVar24;
    fVar49 = this->mLeafVerts[2].x;
    fVar43 = fVar29 - fVar24;
    fVar24 = fVar49 - fVar24;
    if (fVar43 <= fVar44) {
      fVar23 = fVar44;
      fVar33 = fVar43;
      if (fVar24 <= fVar43) {
        fVar33 = fVar24;
      }
    }
    else {
      fVar23 = fVar43;
      fVar33 = fVar44;
      if (fVar24 <= fVar44) {
        fVar33 = fVar24;
      }
    }
    if (fVar40 < fVar33) {
      return;
    }
    fVar33 = fVar24;
    if (fVar24 <= fVar23) {
      fVar33 = fVar23;
    }
    if (fVar33 < -fVar40) {
      return;
    }
    fVar23 = this->mLeafVerts[0].y;
    fVar33 = this->mLeafVerts[1].y;
    fVar47 = fVar23 - fVar22;
    fVar35 = this->mLeafVerts[2].y;
    fVar45 = fVar33 - fVar22;
    fVar22 = fVar35 - fVar22;
    if (fVar45 <= fVar47) {
      fVar46 = fVar47;
      fVar48 = fVar45;
      if (fVar22 <= fVar45) {
        fVar48 = fVar22;
      }
    }
    else {
      fVar46 = fVar45;
      fVar48 = fVar47;
      if (fVar22 <= fVar47) {
        fVar48 = fVar22;
      }
    }
    if (fVar42 < fVar48) {
      return;
    }
    fVar48 = fVar22;
    if (fVar22 <= fVar46) {
      fVar48 = fVar46;
    }
    if (fVar48 < -fVar42) {
      return;
    }
    fVar46 = this->mLeafVerts[0].z;
    fVar48 = this->mLeafVerts[1].z;
    fVar31 = fVar48 - fVar21;
    fVar50 = this->mLeafVerts[2].z;
    fVar25 = fVar46 - fVar21;
    fVar21 = fVar50 - fVar21;
    if (fVar31 <= fVar25) {
      fVar26 = fVar25;
      fVar27 = fVar31;
      if (fVar21 <= fVar31) {
        fVar27 = fVar21;
      }
    }
    else {
      fVar26 = fVar31;
      fVar27 = fVar25;
      if (fVar21 <= fVar25) {
        fVar27 = fVar21;
      }
    }
    if (local_78 < fVar27) {
      return;
    }
    fVar27 = fVar21;
    if (fVar21 <= fVar26) {
      fVar27 = fVar26;
    }
    if (fVar27 < -local_78) {
      return;
    }
    v0 = this->mLeafVerts;
    v1 = this->mLeafVerts + 1;
    v2 = this->mLeafVerts + 2;
    fVar36 = fVar45 - fVar47;
    fVar26 = fVar21 - fVar31;
    fVar32 = fVar43 - fVar44;
    fVar34 = fVar24 - fVar43;
    fVar27 = fVar31 - fVar25;
    fVar30 = fVar22 - fVar45;
    normal.x = fVar36 * fVar26 - fVar30 * fVar27;
    normal.y = fVar34 * fVar27 - fVar26 * fVar32;
    normal.z = fVar32 * fVar30 - fVar34 * fVar36;
    for (lVar11 = 0; lVar11 != 3; lVar11 = lVar11 + 1) {
      fVar39 = *(float *)((long)&local_80 + lVar11 * 4);
      fVar37 = fVar39;
      if ((&normal.x)[lVar11] <= 0.0) {
        fVar37 = -fVar39;
      }
      uVar20 = -(uint)(0.0 < (&normal.x)[lVar11]);
      (&vmin.x)[lVar11] = (float)(~uVar20 & (uint)fVar39 | (uint)-fVar39 & uVar20);
      (&vmax.x)[lVar11] = fVar37;
    }
    fVar39 = (-normal.x * fVar44 - fVar47 * normal.y) - normal.z * fVar25;
    if (0.0 < vmin.z * normal.z + vmin.x * normal.x + vmin.y * normal.y + fVar39) {
      return;
    }
    if (fVar39 + vmax.z * normal.z + normal.x * vmax.x + vmax.y * normal.y < 0.0) {
      return;
    }
    if (this->mFullPrimBoxTest == true) {
      fVar37 = fVar27 * fVar47 + -fVar36 * fVar25;
      fVar38 = fVar27 * fVar22 + -fVar36 * fVar21;
      fVar39 = fVar38;
      if (fVar37 <= fVar38) {
        fVar39 = fVar37;
      }
      fVar28 = ABS(fVar27) * fVar42 + local_78 * ABS(fVar36);
      if (fVar28 < fVar39) {
        return;
      }
      if (fVar37 <= fVar38) {
        fVar37 = fVar38;
      }
      if (fVar37 < -fVar28) {
        return;
      }
      fVar37 = fVar32 * fVar25 + -fVar27 * fVar44;
      fVar38 = fVar32 * fVar21 + -fVar27 * fVar24;
      fVar39 = fVar38;
      if (fVar37 <= fVar38) {
        fVar39 = fVar37;
      }
      fVar27 = ABS(fVar27) * fVar40 + local_78 * ABS(fVar32);
      if (fVar27 < fVar39) {
        return;
      }
      if (fVar37 <= fVar38) {
        fVar37 = fVar38;
      }
      if (fVar37 < -fVar27) {
        return;
      }
      fVar39 = fVar36 * fVar43 + -fVar32 * fVar45;
      fVar37 = fVar36 * fVar24 + -fVar32 * fVar22;
      fVar27 = fVar37;
      if (fVar39 <= fVar37) {
        fVar27 = fVar39;
      }
      fVar32 = ABS(fVar36) * fVar40 + ABS(fVar32) * fVar42;
      if (fVar32 < fVar27) {
        return;
      }
      if (fVar39 <= fVar37) {
        fVar39 = fVar37;
      }
      if (fVar39 < -fVar32) {
        return;
      }
      fVar27 = fVar47 * fVar26 - fVar30 * fVar25;
      fVar36 = fVar22 * fVar26 - fVar30 * fVar21;
      fVar32 = fVar36;
      if (fVar27 <= fVar36) {
        fVar32 = fVar27;
      }
      fVar39 = ABS(fVar26) * fVar42 + local_78 * ABS(fVar30);
      if (fVar39 < fVar32) {
        return;
      }
      if (fVar27 <= fVar36) {
        fVar27 = fVar36;
      }
      if (fVar27 < -fVar39) {
        return;
      }
      fVar27 = fVar25 * fVar34 - fVar44 * fVar26;
      fVar32 = fVar21 * fVar34 - fVar24 * fVar26;
      fVar21 = fVar32;
      if (fVar27 <= fVar32) {
        fVar21 = fVar27;
      }
      fVar26 = ABS(fVar26) * fVar40 + local_78 * ABS(fVar34);
      if (fVar26 < fVar21) {
        return;
      }
      if (fVar27 <= fVar32) {
        fVar27 = fVar32;
      }
      if (fVar27 < -fVar26) {
        return;
      }
      fVar21 = fVar30 * fVar44 - fVar47 * fVar34;
      fVar27 = fVar30 * fVar43 - fVar34 * fVar45;
      fVar26 = fVar27;
      if (fVar21 <= fVar27) {
        fVar26 = fVar21;
      }
      fVar30 = ABS(fVar30) * fVar40 + ABS(fVar34) * fVar42;
      if (fVar30 < fVar26) {
        return;
      }
      if (fVar21 <= fVar27) {
        fVar21 = fVar27;
      }
      if (fVar21 < -fVar30) {
        return;
      }
      fVar30 = fVar23 - fVar35;
      fVar27 = fVar46 - fVar50;
      fVar21 = fVar47 * fVar27 - fVar25 * fVar30;
      fVar32 = fVar27 * fVar45 - fVar31 * fVar30;
      fVar26 = ABS(fVar27) * fVar42 + local_78 * ABS(fVar30);
      fVar47 = fVar32;
      if (fVar21 <= fVar32) {
        fVar47 = fVar21;
      }
      if (fVar26 < fVar47) {
        return;
      }
      if (fVar21 <= fVar32) {
        fVar21 = fVar32;
      }
      if (fVar21 < -fVar26) {
        return;
      }
      fVar26 = fVar41 - fVar49;
      fVar44 = fVar26 * fVar25 - fVar44 * fVar27;
      fVar47 = fVar31 * fVar26 - fVar27 * fVar43;
      fVar21 = fVar47;
      if (fVar44 <= fVar47) {
        fVar21 = fVar44;
      }
      fVar25 = ABS(fVar27) * fVar40 + local_78 * ABS(fVar26);
      if (fVar25 < fVar21) {
        return;
      }
      if (fVar44 <= fVar47) {
        fVar44 = fVar47;
      }
      if (fVar44 < -fVar25) {
        return;
      }
      fVar43 = fVar30 * fVar43 - fVar45 * fVar26;
      fVar22 = fVar30 * fVar24 - fVar22 * fVar26;
      fVar21 = fVar22;
      if (fVar43 <= fVar22) {
        fVar21 = fVar43;
      }
      fVar24 = ABS(fVar30) * fVar40 + fVar42 * ABS(fVar26);
      if (fVar24 < fVar21) {
        return;
      }
      if (fVar43 <= fVar22) {
        fVar43 = fVar22;
      }
      if (fVar43 < -fVar24) {
        return;
      }
    }
    b_00 = (AABBQuantizedNoLeafNode *)b->mPosData;
    if (((ulong)b_00 & 1) == 0) {
      _CollideBoxTri(this,b_00);
    }
    else {
      pMVar8 = this->mIMesh0;
      uVar15 = (udword)((ulong)b_00 >> 1);
      uVar12 = (ulong)(pMVar8->mTriStride * uVar15);
      pIVar9 = pMVar8->mTris;
      pPVar13 = pMVar8->mVerts;
      uVar7 = pMVar8->mVertexStride;
      uVar16 = (ulong)(*(int *)((long)pIVar9->mVRef + uVar12) * uVar7);
      uVar18 = (ulong)(*(int *)((long)pIVar9->mVRef + uVar12 + 4) * uVar7);
      uVar12 = (ulong)(uVar7 * *(int *)((long)pIVar9->mVRef + uVar12 + 8));
      this->mNbPrimPrimTests = this->mNbPrimPrimTests + 1;
      vmin.x = (fVar33 - fVar23) * (fVar50 - fVar46) - (fVar35 - fVar23) * (fVar48 - fVar46);
      fVar21 = *(float *)((long)&pPVar13->z + uVar16);
      fVar22 = *(float *)((long)&pPVar13->z + uVar18);
      fVar24 = *(float *)((long)&pPVar13->x + uVar12);
      fVar31 = (fVar48 - fVar46) * (fVar49 - fVar41) - (fVar50 - fVar46) * (fVar29 - fVar41);
      fVar26 = (fVar29 - fVar41) * (fVar35 - fVar23) - (fVar49 - fVar41) * (fVar33 - fVar23);
      vmin.z = fVar26;
      vmin.y = fVar31;
      fVar45 = -fVar26 * fVar46 + (-vmin.x * fVar41 - fVar23 * fVar31);
      uVar3 = *(undefined8 *)((long)&pPVar13->x + uVar16);
      fVar42 = (float)uVar3;
      fVar43 = (float)((ulong)uVar3 >> 0x20);
      uVar3 = *(undefined8 *)((long)&pPVar13->x + uVar18);
      uVar4 = *(undefined8 *)((long)&pPVar13->y + uVar12);
      fVar47 = (float)uVar4;
      fVar25 = (float)((ulong)uVar4 >> 0x20);
      fVar40 = fVar25 * fVar26 + vmin.x * fVar24 + fVar31 * fVar47 + fVar45;
      fVar27 = (float)uVar3;
      fVar30 = (float)((ulong)uVar3 >> 0x20);
      fVar44 = fVar45 + fVar21 * fVar26 + fVar42 * vmin.x + fVar43 * fVar31;
      fVar45 = fVar45 + fVar22 * fVar26 + fVar27 * vmin.x + fVar30 * fVar31;
      fVar44 = (float)(-(uint)(1e-06 <= ABS(fVar44)) & (uint)fVar44);
      fVar45 = (float)(-(uint)(1e-06 <= ABS(fVar45)) & (uint)fVar45);
      fVar40 = (float)(~-(uint)(ABS(fVar40) < 1e-06) & (uint)fVar40);
      if ((fVar44 * fVar45 <= 0.0) || (fVar44 * fVar40 <= 0.0)) {
        fVar27 = fVar27 - fVar42;
        fVar30 = fVar30 - fVar43;
        fVar22 = fVar22 - fVar21;
        fVar24 = fVar24 - fVar42;
        fVar47 = fVar47 - fVar43;
        fVar25 = fVar25 - fVar21;
        fVar32 = fVar22 * fVar24 - fVar25 * fVar27;
        fVar24 = fVar27 * fVar47 - fVar24 * fVar30;
        fVar22 = fVar30 * fVar25 - fVar47 * fVar22;
        fVar21 = fVar21 * -fVar24 + -fVar22 * fVar42 + -fVar32 * fVar43;
        fVar49 = fVar50 * fVar24 + fVar49 * fVar22 + fVar32 * fVar35 + fVar21;
        fVar29 = fVar48 * fVar24 + fVar29 * fVar22 + fVar32 * fVar33 + fVar21;
        fVar21 = fVar46 * fVar24 + fVar41 * fVar22 + fVar32 * fVar23 + fVar21;
        fVar29 = (float)(-(uint)(1e-06 <= ABS(fVar29)) & (uint)fVar29);
        fVar21 = (float)(-(uint)(1e-06 <= ABS(fVar21)) & (uint)fVar21);
        fVar49 = (float)(~-(uint)(ABS(fVar49) < 1e-06) & (uint)fVar49);
        if ((fVar21 * fVar29 <= 0.0) || (fVar21 * fVar49 <= 0.0)) {
          pPVar17 = (Point *)((long)&pPVar13->x + uVar16);
          pPVar19 = (Point *)((long)&pPVar13->x + uVar18);
          pPVar13 = (Point *)((long)&pPVar13->x + uVar12);
          fVar42 = ABS(fVar24 * fVar31 + fVar32 * -fVar26);
          fVar24 = ABS(fVar22 * fVar26 + fVar24 * -vmin.x);
          fVar41 = fVar24;
          if (fVar24 <= fVar42) {
            fVar41 = fVar42;
          }
          uVar20 = (uint)(fVar42 < fVar24);
          if (fVar41 < ABS(vmin.x * fVar32 + fVar22 * -fVar31)) {
            uVar20 = 2;
          }
          uVar12 = (ulong)(uVar20 << 2);
          fVar41 = *(float *)((long)&v0->x + uVar12);
          fVar22 = *(float *)((long)&v1->x + uVar12);
          fVar24 = *(float *)((long)&v2->x + uVar12);
          fVar42 = *(float *)((long)&pPVar17->x + uVar12);
          fVar43 = *(float *)((long)&pPVar19->x + uVar12);
          fVar23 = *(float *)((long)&pPVar13->x + uVar12);
          if (fVar21 * fVar29 <= 0.0) {
            if (0.0 < fVar21 * fVar49) {
              fVar35 = (fVar41 - fVar22) * fVar29;
              fVar47 = (fVar24 - fVar22) * fVar29;
              fVar33 = fVar29 - fVar49;
              fVar49 = fVar29 - fVar21;
              fVar41 = fVar22;
              goto LAB_001a2f11;
            }
            if (((fVar21 != 0.0) || (NAN(fVar21))) || (0.0 < fVar29 * fVar49)) {
              fVar35 = (fVar22 - fVar41) * fVar21;
              fVar47 = (fVar24 - fVar41) * fVar21;
              fVar33 = fVar21 - fVar49;
              fVar49 = fVar21 - fVar29;
              goto LAB_001a2f11;
            }
            if ((fVar29 != 0.0) || (NAN(fVar29))) {
              fVar35 = (fVar41 - fVar22) * fVar29;
              fVar47 = (fVar24 - fVar22) * fVar29;
              fVar33 = fVar29 - fVar49;
              fVar49 = fVar29 - fVar21;
              fVar41 = fVar22;
              goto LAB_001a2f11;
            }
            if ((fVar49 != 0.0) || (NAN(fVar49))) {
              fVar35 = (fVar41 - fVar24) * fVar49;
              fVar47 = (fVar22 - fVar24) * fVar49;
              fVar33 = fVar49 - fVar29;
              fVar49 = fVar49 - fVar21;
              fVar41 = fVar24;
              goto LAB_001a2f11;
            }
LAB_001a37c2:
            BVar10 = CoplanarTriTri(&vmin,v0,v1,v2,pPVar17,pPVar19,pPVar13);
            if (BVar10 != 0) {
LAB_001a303c:
              uVar20 = (this->mPairs).mCurNbEntries;
              if (uVar20 == (this->mPairs).mMaxNbEntries) {
                IceCore::Container::Resize(&this->mPairs,1);
                uVar20 = (this->mPairs).mCurNbEntries;
              }
              puVar14 = (this->mPairs).mEntries;
              (this->mPairs).mCurNbEntries = uVar20 + 1;
              puVar14[uVar20] = uVar15;
              uVar20 = (this->mPairs).mCurNbEntries;
              uVar7 = this->mLeafIndex;
              if (uVar20 == (this->mPairs).mMaxNbEntries) {
                IceCore::Container::Resize(&this->mPairs,1);
                puVar14 = (this->mPairs).mEntries;
                uVar20 = (this->mPairs).mCurNbEntries;
              }
              (this->mPairs).mCurNbEntries = uVar20 + 1;
              puVar14[uVar20] = uVar7;
              puVar14 = &(this->super_Collider).mFlags;
              *(byte *)puVar14 = (byte)*puVar14 | 4;
            }
          }
          else {
            fVar35 = (fVar41 - fVar24) * fVar49;
            fVar47 = (fVar22 - fVar24) * fVar49;
            fVar33 = fVar49 - fVar29;
            fVar49 = fVar49 - fVar21;
            fVar41 = fVar24;
LAB_001a2f11:
            if (fVar44 * fVar45 <= 0.0) {
              if (fVar44 * fVar40 <= 0.0) {
                if ((fVar44 != 0.0) || (0.0 < fVar45 * fVar40)) {
                  fVar21 = (fVar23 - fVar42) * fVar44;
                  fVar22 = (fVar43 - fVar42) * fVar44;
                  fVar29 = fVar44 - fVar45;
                  fVar40 = fVar44 - fVar40;
                  goto LAB_001a2fc7;
                }
                if ((fVar45 == 0.0) && (!NAN(fVar45))) {
                  if ((fVar40 == 0.0) && (!NAN(fVar40))) goto LAB_001a37c2;
                  goto LAB_001a2f1a;
                }
              }
              fVar21 = (fVar23 - fVar43) * fVar45;
              fVar22 = (fVar42 - fVar43) * fVar45;
              fVar29 = fVar45 - fVar44;
              fVar40 = fVar45 - fVar40;
              fVar42 = fVar43;
            }
            else {
LAB_001a2f1a:
              fVar21 = (fVar43 - fVar23) * fVar40;
              fVar22 = (fVar42 - fVar23) * fVar40;
              fVar29 = fVar40 - fVar44;
              fVar40 = fVar40 - fVar45;
              fVar42 = fVar23;
            }
LAB_001a2fc7:
            fVar43 = fVar49 * fVar33;
            fVar44 = fVar40 * fVar29;
            fVar41 = fVar41 * fVar43 * fVar44;
            fVar24 = fVar41 + fVar44 * fVar35 * fVar33;
            fVar41 = fVar41 + fVar44 * fVar47 * fVar49;
            fVar42 = fVar43 * fVar44 * fVar42;
            fVar49 = fVar43 * fVar21 * fVar29 + fVar42;
            fVar42 = fVar43 * fVar22 * fVar40 + fVar42;
            fVar29 = fVar24;
            if (fVar24 <= fVar41) {
              fVar29 = fVar41;
            }
            fVar21 = fVar49;
            if (fVar42 <= fVar49) {
              fVar21 = fVar42;
            }
            if (fVar21 <= fVar29) {
              if (fVar24 <= fVar41) {
                fVar41 = fVar24;
              }
              if (fVar42 <= fVar49) {
                fVar42 = fVar49;
              }
              if (fVar41 <= fVar42) goto LAB_001a303c;
            }
          }
        }
      }
    }
    if ((~(this->super_Collider).mFlags & 5) == 0) {
      return;
    }
    b = (AABBQuantizedNoLeafNode *)b->mNegData;
  } while (((ulong)b & 1) == 0);
  pMVar8 = this->mIMesh0;
  uVar15 = (udword)((ulong)b >> 1);
  uVar12 = (ulong)(pMVar8->mTriStride * uVar15);
  pIVar9 = pMVar8->mTris;
  uVar7 = pMVar8->mVertexStride;
  uVar16 = (ulong)(*(int *)((long)pIVar9->mVRef + uVar12) * uVar7);
  uVar18 = (ulong)(*(int *)((long)pIVar9->mVRef + uVar12 + 4) * uVar7);
  uVar12 = (ulong)(uVar7 * *(int *)((long)pIVar9->mVRef + uVar12 + 8));
  pPVar13 = pMVar8->mVerts;
  this->mNbPrimPrimTests = this->mNbPrimPrimTests + 1;
  fVar41 = this->mLeafVerts[1].x;
  fVar29 = this->mLeafVerts[0].x;
  fVar49 = this->mLeafVerts[1].y;
  fVar21 = this->mLeafVerts[1].z;
  fVar22 = this->mLeafVerts[2].y;
  fVar24 = this->mLeafVerts[2].z;
  fVar40 = *(float *)((long)&pPVar13->z + uVar16);
  uVar2 = this->mLeafVerts[0].y;
  uVar6 = this->mLeafVerts[0].z;
  fVar43 = fVar49 - (float)uVar2;
  fVar44 = this->mLeafVerts[2].x - fVar29;
  fVar23 = fVar41 - fVar29;
  fVar33 = fVar22 - (float)uVar2;
  fVar35 = fVar21 - (float)uVar6;
  fVar45 = fVar24 - (float)uVar6;
  vmin.x = fVar43 * fVar45 - fVar35 * fVar33;
  fVar42 = *(float *)((long)&pPVar13->z + uVar18);
  vmin.y = fVar35 * fVar44 - fVar45 * fVar23;
  vmin.z = fVar33 * fVar23 - fVar44 * fVar43;
  fVar43 = *(float *)((long)&pPVar13->x + uVar12);
  fVar44 = (float)uVar6 * -vmin.z + (-vmin.x * fVar29 - (float)uVar2 * vmin.y);
  uVar3 = *(undefined8 *)((long)&pPVar13->y + uVar12);
  fVar47 = (float)uVar3;
  fVar46 = (float)((ulong)uVar3 >> 0x20);
  uVar3 = *(undefined8 *)((long)&pPVar13->x + uVar16);
  uVar4 = *(undefined8 *)((long)&pPVar13->x + uVar18);
  fVar48 = (float)uVar4;
  fVar50 = (float)((ulong)uVar4 >> 0x20);
  fVar35 = (float)uVar3;
  fVar45 = (float)((ulong)uVar3 >> 0x20);
  fVar33 = fVar46 * vmin.z + vmin.x * fVar43 + vmin.y * fVar47 + fVar44;
  fVar23 = fVar44 + fVar40 * vmin.z + fVar35 * vmin.x + fVar45 * vmin.y;
  fVar44 = fVar44 + fVar42 * vmin.z + fVar48 * vmin.x + fVar50 * vmin.y;
  fVar23 = (float)(-(uint)(1e-06 <= ABS(fVar23)) & (uint)fVar23);
  fVar44 = (float)(-(uint)(1e-06 <= ABS(fVar44)) & (uint)fVar44);
  fVar33 = (float)(~-(uint)(ABS(fVar33) < 1e-06) & (uint)fVar33);
  if ((0.0 < fVar23 * fVar44) && (0.0 < fVar23 * fVar33)) {
    return;
  }
  fVar48 = fVar48 - fVar35;
  fVar50 = fVar50 - fVar45;
  fVar42 = fVar42 - fVar40;
  fVar43 = fVar43 - fVar35;
  fVar47 = fVar47 - fVar45;
  fVar46 = fVar46 - fVar40;
  fVar25 = fVar42 * fVar43 - fVar46 * fVar48;
  fVar43 = fVar48 * fVar47 - fVar43 * fVar50;
  fVar42 = fVar50 * fVar46 - fVar47 * fVar42;
  local_e8 = this->mLeafVerts[2].x;
  fVar40 = fVar40 * -fVar43 + -fVar42 * fVar35 + -fVar25 * fVar45;
  fVar22 = fVar24 * fVar43 + local_e8 * fVar42 + fVar25 * fVar22 + fVar40;
  fVar41 = fVar21 * fVar43 + fVar41 * fVar42 + fVar25 * fVar49 + fVar40;
  fVar40 = (float)uVar6 * fVar43 + fVar29 * fVar42 + fVar25 * (float)uVar2 + fVar40;
  fVar41 = (float)(-(uint)(1e-06 <= ABS(fVar41)) & (uint)fVar41);
  fVar40 = (float)(-(uint)(1e-06 <= ABS(fVar40)) & (uint)fVar40);
  fVar22 = (float)(~-(uint)(ABS(fVar22) < 1e-06) & (uint)fVar22);
  if ((0.0 < fVar40 * fVar41) && (0.0 < fVar40 * fVar22)) {
    return;
  }
  pPVar17 = (Point *)((long)&pPVar13->x + uVar16);
  pPVar19 = (Point *)((long)&pPVar13->x + uVar18);
  pPVar13 = (Point *)((long)&pPVar13->x + uVar12);
  fVar49 = ABS(fVar43 * vmin.y + fVar25 * -vmin.z);
  fVar21 = ABS(fVar42 * vmin.z + fVar43 * -vmin.x);
  fVar29 = fVar21;
  if (fVar21 <= fVar49) {
    fVar29 = fVar49;
  }
  uVar20 = (uint)(fVar49 < fVar21);
  if (fVar29 < ABS(vmin.x * fVar25 + fVar42 * -vmin.y)) {
    uVar20 = 2;
  }
  uVar12 = (ulong)(uVar20 << 2);
  fVar29 = *(float *)((long)&v0->x + uVar12);
  fVar49 = *(float *)((long)&v1->x + uVar12);
  fVar21 = *(float *)((long)&v2->x + uVar12);
  fVar24 = *(float *)((long)&pPVar17->x + uVar12);
  fVar42 = *(float *)((long)&pPVar19->x + uVar12);
  fVar43 = *(float *)((long)&pPVar13->x + uVar12);
  if (fVar40 * fVar41 <= 0.0) {
    if (0.0 < fVar40 * fVar22) {
LAB_001a35a1:
      fVar45 = (fVar29 - fVar49) * fVar41;
      fVar47 = (fVar21 - fVar49) * fVar41;
      fVar35 = fVar41 - fVar22;
      fVar22 = fVar41 - fVar40;
      fVar29 = fVar49;
      goto LAB_001a35f5;
    }
    if (((fVar40 != 0.0) || (NAN(fVar40))) || (0.0 < fVar41 * fVar22)) {
      fVar45 = (fVar49 - fVar29) * fVar40;
      fVar47 = (fVar21 - fVar29) * fVar40;
      fVar35 = fVar40 - fVar22;
      fVar22 = fVar40 - fVar41;
      goto LAB_001a35f5;
    }
    if ((fVar41 != 0.0) || (NAN(fVar41))) goto LAB_001a35a1;
    if ((fVar22 != 0.0) || (NAN(fVar22))) goto LAB_001a3550;
LAB_001a3807:
    BVar10 = CoplanarTriTri(&vmin,v0,v1,v2,pPVar17,pPVar19,pPVar13);
    if (BVar10 == 0) {
      return;
    }
    goto LAB_001a3726;
  }
LAB_001a3550:
  fVar45 = (fVar29 - fVar21) * fVar22;
  fVar47 = (fVar49 - fVar21) * fVar22;
  fVar35 = fVar22 - fVar41;
  fVar22 = fVar22 - fVar40;
  fVar29 = fVar21;
LAB_001a35f5:
  if (fVar23 * fVar44 <= 0.0) {
    if (fVar23 * fVar33 <= 0.0) {
      if (((fVar23 != 0.0) || (NAN(fVar23))) || (0.0 < fVar44 * fVar33)) {
        fVar49 = (fVar43 - fVar24) * fVar23;
        fVar21 = (fVar42 - fVar24) * fVar23;
        fVar41 = fVar23 - fVar44;
        fVar33 = fVar23 - fVar33;
        goto LAB_001a36aa;
      }
      if ((fVar44 == 0.0) && (!NAN(fVar44))) {
        if ((fVar33 == 0.0) && (!NAN(fVar33))) goto LAB_001a3807;
        goto LAB_001a3602;
      }
    }
    fVar49 = (fVar43 - fVar42) * fVar44;
    fVar21 = (fVar24 - fVar42) * fVar44;
    fVar41 = fVar44 - fVar23;
    fVar33 = fVar44 - fVar33;
    fVar24 = fVar42;
  }
  else {
LAB_001a3602:
    fVar49 = (fVar42 - fVar43) * fVar33;
    fVar21 = (fVar24 - fVar43) * fVar33;
    fVar41 = fVar33 - fVar23;
    fVar33 = fVar33 - fVar44;
    fVar24 = fVar43;
  }
LAB_001a36aa:
  fVar40 = fVar22 * fVar35;
  fVar42 = fVar33 * fVar41;
  fVar29 = fVar29 * fVar40 * fVar42;
  fVar43 = fVar29 + fVar42 * fVar45 * fVar35;
  fVar29 = fVar29 + fVar42 * fVar47 * fVar22;
  fVar24 = fVar40 * fVar42 * fVar24;
  fVar49 = fVar40 * fVar49 * fVar41 + fVar24;
  fVar24 = fVar40 * fVar21 * fVar33 + fVar24;
  fVar41 = fVar43;
  if (fVar43 <= fVar29) {
    fVar41 = fVar29;
  }
  fVar21 = fVar49;
  if (fVar24 <= fVar49) {
    fVar21 = fVar24;
  }
  if (fVar41 < fVar21) {
    return;
  }
  if (fVar43 <= fVar29) {
    fVar29 = fVar43;
  }
  if (fVar24 <= fVar49) {
    fVar24 = fVar49;
  }
  if (fVar24 < fVar29) {
    return;
  }
LAB_001a3726:
  uVar20 = (this->mPairs).mCurNbEntries;
  if (uVar20 == (this->mPairs).mMaxNbEntries) {
    IceCore::Container::Resize(&this->mPairs,1);
    uVar20 = (this->mPairs).mCurNbEntries;
  }
  puVar14 = (this->mPairs).mEntries;
  (this->mPairs).mCurNbEntries = uVar20 + 1;
  puVar14[uVar20] = uVar15;
  uVar20 = (this->mPairs).mCurNbEntries;
  uVar7 = this->mLeafIndex;
  if (uVar20 == (this->mPairs).mMaxNbEntries) {
    IceCore::Container::Resize(&this->mPairs,1);
    puVar14 = (this->mPairs).mEntries;
    uVar20 = (this->mPairs).mCurNbEntries;
  }
  (this->mPairs).mCurNbEntries = uVar20 + 1;
  puVar14[uVar20] = uVar7;
  puVar14 = &(this->super_Collider).mFlags;
  *(byte *)puVar14 = (byte)*puVar14 | 4;
  return;
}

Assistant:

void AABBTreeCollider::_CollideBoxTri(const AABBQuantizedNoLeafNode* b)
{
	// Dequantize box
	const QuantizedAABB* bb = &b->mAABB;
	const Point Pa(float(bb->mCenter[0]) * mCenterCoeff0.x, float(bb->mCenter[1]) * mCenterCoeff0.y, float(bb->mCenter[2]) * mCenterCoeff0.z);
	const Point ea(float(bb->mExtents[0]) * mExtentsCoeff0.x, float(bb->mExtents[1]) * mExtentsCoeff0.y, float(bb->mExtents[2]) * mExtentsCoeff0.z);

	// Perform triangle-box overlap test
	if(!TriBoxOverlap(Pa, ea))	return;

	if(b->HasPosLeaf())	PrimTestIndexTri(b->GetPosPrimitive());
	else				_CollideBoxTri(b->GetPos());

	if(ContactFound()) return;

	if(b->HasNegLeaf())	PrimTestIndexTri(b->GetNegPrimitive());
	else				_CollideBoxTri(b->GetNeg());
}